

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator * __thiscall
QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::
emplace_helper<QOpenGL2GradientCache::CacheInfo>
          (iterator *__return_storage_ptr__,
          QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *this,
          unsigned_long_long *key,CacheInfo *args)

{
  byte bVar1;
  Entry *pEVar2;
  qsizetype qVar3;
  undefined8 uVar4;
  GLuint GVar5;
  GLuint GVar6;
  GLuint GVar7;
  GLuint GVar8;
  GLuint *pGVar9;
  long in_FS_OFFSET;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QHashPrivate::Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_>
  ::findOrInsert<unsigned_long_long>((InsertionResult *)local_58,this->d,key);
  pEVar2 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries;
  bVar1 = (*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
          [(uint)local_58._8_8_ & 0x7f];
  if (local_58[0x10] == false) {
    pGVar9 = (GLuint *)operator_new(0x38);
    *pGVar9 = args->texId;
    GVar5 = *(GLuint *)&(args->stops).d.d;
    GVar6 = *(GLuint *)((long)&(args->stops).d.d + 4);
    GVar7 = *(GLuint *)&(args->stops).d.ptr;
    GVar8 = *(GLuint *)((long)&(args->stops).d.ptr + 4);
    (args->stops).d.d = (Data *)0x0;
    (args->stops).d.ptr = (pair<double,_QColor> *)0x0;
    pGVar9[2] = GVar5;
    pGVar9[3] = GVar6;
    pGVar9[4] = GVar7;
    pGVar9[5] = GVar8;
    qVar3 = (args->stops).d.size;
    (args->stops).d.size = 0;
    *(qsizetype *)(pGVar9 + 6) = qVar3;
    *(qreal *)(pGVar9 + 8) = args->opacity;
    pGVar9[10] = args->interpolationMode;
    pGVar9[0xc] = 0;
    pGVar9[0xd] = 0;
    *(unsigned_long_long *)pEVar2[bVar1].storage.data = *key;
    *(GLuint **)(pEVar2[bVar1].storage.data + 8) = pGVar9;
  }
  else {
    pGVar9 = (GLuint *)operator_new(0x38);
    *pGVar9 = args->texId;
    GVar5 = *(GLuint *)&(args->stops).d.d;
    GVar6 = *(GLuint *)((long)&(args->stops).d.d + 4);
    GVar7 = *(GLuint *)&(args->stops).d.ptr;
    GVar8 = *(GLuint *)((long)&(args->stops).d.ptr + 4);
    (args->stops).d.d = (Data *)0x0;
    (args->stops).d.ptr = (pair<double,_QColor> *)0x0;
    pGVar9[2] = GVar5;
    pGVar9[3] = GVar6;
    pGVar9[4] = GVar7;
    pGVar9[5] = GVar8;
    qVar3 = (args->stops).d.size;
    (args->stops).d.size = 0;
    *(qsizetype *)(pGVar9 + 6) = qVar3;
    *(qreal *)(pGVar9 + 8) = args->opacity;
    pGVar9[10] = args->interpolationMode;
    uVar4 = *(undefined8 *)(pEVar2[bVar1].storage.data + 8);
    *(GLuint **)(pEVar2[bVar1].storage.data + 8) = pGVar9;
    *(undefined8 *)(pGVar9 + 0xc) = uVar4;
  }
  this->m_size = this->m_size + 1;
  (__return_storage_ptr__->i).d =
       (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> *)
       local_58._0_8_;
  (__return_storage_ptr__->i).bucket = local_58._8_8_;
  __return_storage_ptr__->e = (Chain **)0x0;
  if ((Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> *)
      local_58._0_8_ !=
      (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> *)0x0) {
    __return_storage_ptr__->e =
         (Chain **)
         ((*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].entries
          [(*(Span **)(local_58._0_8_ + 0x20))[(ulong)local_58._8_8_ >> 7].offsets
           [(uint)local_58._8_8_ & 0x7f]].storage.data + 8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace_helper(Key &&key, Args &&...args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->insertMulti(std::forward<Args>(args)...);
        ++m_size;
        return iterator(result.it);
    }